

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

ListNode * get_allocated_blocks_list(void)

{
  long *in_FS_OFFSET;
  
  if (*(long *)(*in_FS_OFFSET + -0x38) == 0) {
    list_initialize((ListNode *)(*in_FS_OFFSET + -0x38));
    *(undefined8 *)(*in_FS_OFFSET + -0x38) = 1;
  }
  return (ListNode *)(*in_FS_OFFSET + -0x38);
}

Assistant:

static ListNode* get_allocated_blocks_list(void) {
    /* If it initialized, initialize the list of allocated blocks. */
    if (!global_allocated_blocks.value) {
        list_initialize(&global_allocated_blocks);
        global_allocated_blocks.value = (void*)1;
    }
    return &global_allocated_blocks;
}